

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O0

string * luna::GetTokenStr_abi_cxx11_(TokenDetail *t)

{
  double *in_RSI;
  string *in_RDI;
  ostringstream oss;
  int token;
  string *str;
  string local_1e0 [32];
  string local_1c0 [40];
  String *in_stack_fffffffffffffe68;
  ostringstream local_190 [376];
  int local_18;
  undefined1 local_11;
  double *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  local_18 = *(int *)(local_10 + 3);
  if (local_18 == 0x117) {
    std::__cxx11::ostringstream::ostringstream(local_190);
    std::ostream::operator<<((ostream *)local_190,*local_10);
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=(in_RDI,local_1c0);
    std::__cxx11::string::~string(local_1c0);
    std::__cxx11::ostringstream::~ostringstream(local_190);
  }
  else if ((local_18 == 0x115) || (local_18 == 0x116)) {
    String::GetStdString_abi_cxx11_(in_stack_fffffffffffffe68);
    std::__cxx11::string::operator=(in_RDI,local_1e0);
    std::__cxx11::string::~string(local_1e0);
  }
  else if ((local_18 < 0x100) || (0x11e < local_18)) {
    std::__cxx11::string::push_back((char)in_RDI);
  }
  else {
    std::__cxx11::string::operator=(in_RDI,*(char **)(token_str + (long)(local_18 + -0x100) * 8));
  }
  return in_RDI;
}

Assistant:

std::string GetTokenStr(const TokenDetail &t)
    {
        std::string str;

        int token = t.token_;
        if (token == Token_Number)
        {
            std::ostringstream oss;
            oss << t.number_;
            str = oss.str();
        }
        else if (token == Token_Id || token == Token_String)
        {
            str = t.str_->GetStdString();
        }
        else if (token >= Token_And && token <= Token_EOF)
        {
            str = token_str[token - Token_And];
        }
        else
        {
            str.push_back(token);
        }

        return str;
    }